

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pySRUP_Data.cpp
# Opt level: O2

object get_byte_data(SRUP_MSG_DATA *self)

{
  uint16_t uVar1;
  uint8_t *puVar2;
  PyObject *pPVar3;
  SRUP_MSG_DATA *in_RSI;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  puVar2 = SRUP_MSG_DATA::data(in_RSI);
  if (puVar2 == (uint8_t *)0x0) {
    __Py_NoneStruct = __Py_NoneStruct + 1;
    (self->super_SRUP_MSG)._vptr_SRUP_MSG = (_func_int **)&_Py_NoneStruct;
  }
  else {
    uVar1 = SRUP_MSG_DATA::data_length(in_RSI);
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,puVar2,puVar2 + uVar1);
    pPVar3 = boost::python::api::object_initializer_impl<false,false>::get<std::__cxx11::string>
                       (local_38);
    (self->super_SRUP_MSG)._vptr_SRUP_MSG = (_func_int **)pPVar3;
    std::__cxx11::string::~string((string *)local_38);
  }
  return (object)(object_base)self;
}

Assistant:

boost::python::object get_byte_data(SRUP_MSG_DATA &self)
{
    const uint8_t* rv;
    rv = self.data();

    if (rv != nullptr)
        return boost::python::object(std::string((char *) rv, self.data_length()));
    else
        return boost::python::object();
}